

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O3

void __thiscall QTeamCityLogger::~QTeamCityLogger(QTeamCityLogger *this)

{
  char *pcVar1;
  
  (this->super_QAbstractTestLogger)._vptr_QAbstractTestLogger =
       (_func_int **)&PTR__QTeamCityLogger_0016f4d8;
  pcVar1 = (this->flowID).buf;
  if (pcVar1 != (this->flowID).staticBuf) {
    free(pcVar1);
  }
  pcVar1 = (this->pendingMessages).buf;
  if (pcVar1 != (this->pendingMessages).staticBuf) {
    free(pcVar1);
  }
  pcVar1 = (this->currTestFuncName).buf;
  if (pcVar1 != (this->currTestFuncName).staticBuf) {
    free(pcVar1);
  }
  QAbstractTestLogger::~QAbstractTestLogger(&this->super_QAbstractTestLogger);
  return;
}

Assistant:

void QTeamCityLogger::startLogging()
{
    QAbstractTestLogger::startLogging();

    tcEscapedString(&flowID, QTestResult::currentTestObjectName());

    QTestCharBuffer buf;
    QTest::qt_asprintf(&buf, "##teamcity[testSuiteStarted name='%s' flowId='%s']\n",
                       flowID.constData(), flowID.constData());
    outputString(buf.constData());
}